

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hkdf.c
# Opt level: O0

int mbedtls_hkdf_expand(mbedtls_md_info_t *md,uchar *prk,size_t prk_len,uchar *info,size_t info_len,
                       uchar *okm,size_t okm_len)

{
  byte bVar1;
  ulong uVar2;
  size_t local_e0;
  uchar local_d1;
  size_t sStack_d0;
  uchar c;
  size_t num_to_copy;
  uchar t [64];
  mbedtls_md_context_t ctx;
  ulong uStack_68;
  int ret;
  size_t i;
  size_t t_len;
  size_t n;
  size_t where;
  size_t hash_len;
  uchar *okm_local;
  size_t info_len_local;
  uchar *info_local;
  size_t prk_len_local;
  uchar *prk_local;
  mbedtls_md_info_t *md_local;
  
  n = 0;
  i = 0;
  if (okm == (uchar *)0x0) {
    md_local._4_4_ = -0x5f80;
  }
  else {
    bVar1 = mbedtls_md_get_size(md);
    uVar2 = (ulong)bVar1;
    if ((prk_len < uVar2) || (uVar2 == 0)) {
      md_local._4_4_ = -0x5f80;
    }
    else {
      okm_local = (uchar *)info_len;
      info_len_local = (size_t)info;
      if (info == (uchar *)0x0) {
        info_len_local =
             (long)
             "\n----------------------------------------------------------------------------\n\n" +
             0x4f;
        okm_local = (uchar *)0x0;
      }
      t_len = okm_len / uVar2;
      if (okm_len % uVar2 != 0) {
        t_len = t_len + 1;
      }
      if (t_len < 0x100) {
        mbedtls_md_init((mbedtls_md_context_t *)(t + 0x38));
        ctx.hmac_ctx._4_4_ = mbedtls_md_setup((mbedtls_md_context_t *)(t + 0x38),md,1);
        if (ctx.hmac_ctx._4_4_ == 0) {
          for (uStack_68 = 1; uStack_68 <= t_len; uStack_68 = uStack_68 + 1) {
            local_d1 = (uchar)uStack_68;
            ctx.hmac_ctx._4_4_ =
                 mbedtls_md_hmac_starts((mbedtls_md_context_t *)(t + 0x38),prk,prk_len);
            if ((((ctx.hmac_ctx._4_4_ != 0) ||
                 (ctx.hmac_ctx._4_4_ =
                       mbedtls_md_hmac_update
                                 ((mbedtls_md_context_t *)(t + 0x38),(uchar *)&num_to_copy,i),
                 ctx.hmac_ctx._4_4_ != 0)) ||
                (ctx.hmac_ctx._4_4_ =
                      mbedtls_md_hmac_update
                                ((mbedtls_md_context_t *)(t + 0x38),(uchar *)info_len_local,
                                 (size_t)okm_local), ctx.hmac_ctx._4_4_ != 0)) ||
               ((ctx.hmac_ctx._4_4_ =
                      mbedtls_md_hmac_update((mbedtls_md_context_t *)(t + 0x38),&local_d1,1),
                ctx.hmac_ctx._4_4_ != 0 ||
                (ctx.hmac_ctx._4_4_ =
                      mbedtls_md_hmac_finish
                                ((mbedtls_md_context_t *)(t + 0x38),(uchar *)&num_to_copy),
                ctx.hmac_ctx._4_4_ != 0)))) break;
            local_e0 = uVar2;
            if (uStack_68 == t_len) {
              local_e0 = okm_len - n;
            }
            sStack_d0 = local_e0;
            memcpy(okm + n,&num_to_copy,local_e0);
            n = uVar2 + n;
            i = uVar2;
          }
        }
        mbedtls_md_free((mbedtls_md_context_t *)(t + 0x38));
        mbedtls_platform_zeroize(&num_to_copy,0x40);
        md_local._4_4_ = ctx.hmac_ctx._4_4_;
      }
      else {
        md_local._4_4_ = -0x5f80;
      }
    }
  }
  return md_local._4_4_;
}

Assistant:

int mbedtls_hkdf_expand( const mbedtls_md_info_t *md, const unsigned char *prk,
                         size_t prk_len, const unsigned char *info,
                         size_t info_len, unsigned char *okm, size_t okm_len )
{
    size_t hash_len;
    size_t where = 0;
    size_t n;
    size_t t_len = 0;
    size_t i;
    int ret = 0;
    mbedtls_md_context_t ctx;
    unsigned char t[MBEDTLS_MD_MAX_SIZE];

    if( okm == NULL )
    {
        return( MBEDTLS_ERR_HKDF_BAD_INPUT_DATA );
    }

    hash_len = mbedtls_md_get_size( md );

    if( prk_len < hash_len || hash_len == 0 )
    {
        return( MBEDTLS_ERR_HKDF_BAD_INPUT_DATA );
    }

    if( info == NULL )
    {
        info = (const unsigned char *) "";
        info_len = 0;
    }

    n = okm_len / hash_len;

    if( (okm_len % hash_len) != 0 )
    {
        n++;
    }

    /*
     * Per RFC 5869 Section 2.3, okm_len must not exceed
     * 255 times the hash length
     */
    if( n > 255 )
    {
        return( MBEDTLS_ERR_HKDF_BAD_INPUT_DATA );
    }

    mbedtls_md_init( &ctx );

    if( (ret = mbedtls_md_setup( &ctx, md, 1) ) != 0 )
    {
        goto exit;
    }

    /*
     * Compute T = T(1) | T(2) | T(3) | ... | T(N)
     * Where T(N) is defined in RFC 5869 Section 2.3
     */
    for( i = 1; i <= n; i++ )
    {
        size_t num_to_copy;
        unsigned char c = i & 0xff;

        ret = mbedtls_md_hmac_starts( &ctx, prk, prk_len );
        if( ret != 0 )
        {
            goto exit;
        }

        ret = mbedtls_md_hmac_update( &ctx, t, t_len );
        if( ret != 0 )
        {
            goto exit;
        }

        ret = mbedtls_md_hmac_update( &ctx, info, info_len );
        if( ret != 0 )
        {
            goto exit;
        }

        /* The constant concatenated to the end of each T(n) is a single octet.
         * */
        ret = mbedtls_md_hmac_update( &ctx, &c, 1 );
        if( ret != 0 )
        {
            goto exit;
        }

        ret = mbedtls_md_hmac_finish( &ctx, t );
        if( ret != 0 )
        {
            goto exit;
        }

        num_to_copy = i != n ? hash_len : okm_len - where;
        memcpy( okm + where, t, num_to_copy );
        where += hash_len;
        t_len = hash_len;
    }

exit:
    mbedtls_md_free( &ctx );
    mbedtls_platform_zeroize( t, sizeof( t ) );

    return( ret );
}